

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

void __thiscall
Imf_3_2::DwaCompressor::LossyDctDecoderBase::LossyDctDecoderBase
          (LossyDctDecoderBase *this,char *packedAc,char *packedAcEnd,char *packedDc,
          unsigned_short *toLinear,int width,int height)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  
  *in_RDI = &PTR__LossyDctDecoderBase_004c0600;
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  *(undefined4 *)(in_RDI + 2) = 0;
  in_RDI[3] = in_RSI;
  in_RDI[4] = in_RDX;
  in_RDI[5] = in_RCX;
  in_RDI[6] = in_R8;
  *(undefined4 *)(in_RDI + 7) = in_R9D;
  *(undefined4 *)((long)in_RDI + 0x3c) = in_stack_00000008;
  std::
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ::vector((vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
            *)0x1c3b4a);
  std::vector<Imf_3_2::PixelType,_std::allocator<Imf_3_2::PixelType>_>::vector
            ((vector<Imf_3_2::PixelType,_std::allocator<Imf_3_2::PixelType>_> *)0x1c3b57);
  std::
  vector<Imf_3_2::SimdAlignedBuffer64<float>,_std::allocator<Imf_3_2::SimdAlignedBuffer64<float>_>_>
  ::vector((vector<Imf_3_2::SimdAlignedBuffer64<float>,_std::allocator<Imf_3_2::SimdAlignedBuffer64<float>_>_>
            *)0x1c3b64);
  if (in_RDI[6] == 0) {
    in_RDI[6] = dwaCompressorNoOp;
  }
  *(byte *)(in_RDI + 1) = GLOBAL_SYSTEM_LITTLE_ENDIAN & 1;
  return;
}

Assistant:

DwaCompressor::LossyDctDecoderBase::LossyDctDecoderBase (
    char*                 packedAc,
    char*                 packedAcEnd,
    char*                 packedDc,
    const unsigned short* toLinear,
    int                   width,
    int                   height)
    : _isNativeXdr (false)
    , _packedAcCount (0)
    , _packedDcCount (0)
    , _packedAc (packedAc)
    , _packedAcEnd (packedAcEnd)
    , _packedDc (packedDc)
    , _toLinear (toLinear)
    , _width (width)
    , _height (height)
{
    if (_toLinear == 0) _toLinear = dwaCompressorNoOp;

    _isNativeXdr = GLOBAL_SYSTEM_LITTLE_ENDIAN;
}